

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

void Abc_NtkSetCiArrivalTime(void *pAbc0,int iCi,float Rise,float Fall)

{
  int iVar1;
  uint ObjId;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  Abc_Frame_t *pAbc;
  float Fall_local;
  float Rise_local;
  int iCi_local;
  void *pAbc0_local;
  
  if (pAbc0 == (void *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  else {
    pNtk_00 = Abc_FrameReadNtk((Abc_Frame_t *)pAbc0);
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      printf("Current network in ABC framework is not defined.\n");
    }
    else {
      if ((-1 < iCi) && (iVar1 = Abc_NtkCiNum(pNtk_00), iCi < iVar1)) {
        pObj = Abc_NtkCi(pNtk_00,iCi);
        ObjId = Abc_ObjId(pObj);
        Abc_NtkTimeSetArrival(pNtk_00,ObjId,Rise,Fall);
        return;
      }
      printf("CI index is not valid.\n");
    }
  }
  return;
}

Assistant:

void Abc_NtkSetCiArrivalTime( void * pAbc0, int iCi, float Rise, float Fall )
{
    Abc_Frame_t * pAbc = (Abc_Frame_t *)pAbc0;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    if ( pAbc == NULL )
    {
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
        return;
    }
    pNtk = Abc_FrameReadNtk( pAbc );
    if ( pNtk == NULL )
    {
        printf( "Current network in ABC framework is not defined.\n" );
        return;
    }
    if ( iCi < 0 || iCi >= Abc_NtkCiNum(pNtk) )
    {
        printf( "CI index is not valid.\n" );
        return;
    }
    pNode = Abc_NtkCi( pNtk, iCi );
    Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pNode), Rise, Fall );
}